

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

void mtbdd_refs_mark_task_CALL(WorkerP *w,Task *__dq_head)

{
  long *in_FS_OFFSET;
  Task *__dq_head_local;
  WorkerP *w_local;
  
  mtbdd_refs_mark_p_par_SPAWN
            (w,__dq_head,(MTBDD **)**(undefined8 **)(*in_FS_OFFSET + -0x20),
             *(long *)(*(long *)(*in_FS_OFFSET + -0x20) + 0x10) - **(long **)(*in_FS_OFFSET + -0x20)
             >> 3);
  mtbdd_refs_mark_r_par_SPAWN
            (w,__dq_head + 1,*(MTBDD **)(*(long *)(*in_FS_OFFSET + -0x20) + 0x18),
             *(long *)(*(long *)(*in_FS_OFFSET + -0x20) + 0x28) -
             *(long *)(*(long *)(*in_FS_OFFSET + -0x20) + 0x18) >> 3);
  mtbdd_refs_mark_s_par_CALL
            (w,__dq_head + 2,*(mtbdd_refs_task_t *)(*(long *)(*in_FS_OFFSET + -0x20) + 0x30),
             *(long *)(*(long *)(*in_FS_OFFSET + -0x20) + 0x40) -
             *(long *)(*(long *)(*in_FS_OFFSET + -0x20) + 0x30) >> 4);
  mtbdd_refs_mark_r_par_SYNC(w,__dq_head + 1);
  mtbdd_refs_mark_p_par_SYNC(w,__dq_head);
  return;
}

Assistant:

VOID_TASK_0(mtbdd_refs_mark_task)
{
    LOCALIZE_THREAD_LOCAL(mtbdd_refs_key, mtbdd_refs_internal_t);
    SPAWN(mtbdd_refs_mark_p_par, mtbdd_refs_key->pbegin, mtbdd_refs_key->pcur-mtbdd_refs_key->pbegin);
    SPAWN(mtbdd_refs_mark_r_par, mtbdd_refs_key->rbegin, mtbdd_refs_key->rcur-mtbdd_refs_key->rbegin);
    CALL(mtbdd_refs_mark_s_par, mtbdd_refs_key->sbegin, mtbdd_refs_key->scur-mtbdd_refs_key->sbegin);
    SYNC(mtbdd_refs_mark_r_par);
    SYNC(mtbdd_refs_mark_p_par);
}